

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_read_unsigned_bin(mp_int *a,uchar *b,int c)

{
  int iVar1;
  int iVar2;
  int in_EDX;
  mp_int *in_RSI;
  mp_int *in_RDI;
  int res;
  int in_stack_00000024;
  mp_int *in_stack_00000028;
  int local_4;
  
  if ((1 < in_RDI->alloc) || (local_4 = mp_grow(in_RSI,in_EDX), local_4 == 0)) {
    mp_zero(in_RDI);
    while (iVar2 = in_EDX + -1, 0 < in_EDX) {
      iVar1 = mp_mul_2d(in_stack_00000028,in_stack_00000024,a);
      if (iVar1 != 0) {
        return iVar1;
      }
      *in_RDI->dp = (ulong)(byte)in_RSI->used | *in_RDI->dp;
      in_RDI->used = in_RDI->used + 1;
      in_EDX = iVar2;
      in_RSI = (mp_int *)((long)&in_RSI->used + 1);
    }
    mp_clamp(in_RDI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mp_read_unsigned_bin (mp_int * a, const unsigned char *b, int c)
{
  int     res;

  /* make sure there are at least two digits */
  if (a->alloc < 2) {
     if ((res = mp_grow(a, 2)) != MP_OKAY) {
        return res;
     }
  }

  /* zero the int */
  mp_zero (a);

  /* read the bytes in */
  while (c-- > 0) {
    if ((res = mp_mul_2d (a, 8, a)) != MP_OKAY) {
      return res;
    }

#ifndef MP_8BIT
      a->dp[0] |= *b++;
      a->used += 1;
#else
      a->dp[0] = (*b & MP_MASK);
      a->dp[1] |= ((*b++ >> 7U) & 1);
      a->used += 2;
#endif
  }
  mp_clamp (a);
  return MP_OKAY;
}